

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtVarsAreSymmetric(word *pTruth,int nVars,int i,int j,word *pCof0,word *pCof1)

{
  int iVar1;
  int nWords;
  word *pCof1_local;
  word *pCof0_local;
  int j_local;
  int i_local;
  int nVars_local;
  word *pTruth_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  if ((i < nVars) && (j < nVars)) {
    Abc_TtCofactor0p(pCof0,pTruth,iVar1,i);
    Abc_TtCofactor1p(pCof1,pTruth,iVar1,i);
    Abc_TtCofactor1(pCof0,iVar1,j);
    Abc_TtCofactor0(pCof1,iVar1,j);
    iVar1 = Abc_TtEqual(pCof0,pCof1,iVar1);
    return iVar1;
  }
  __assert_fail("i < nVars && j < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0xd5e,"int Abc_TtVarsAreSymmetric(word *, int, int, int, word *, word *)");
}

Assistant:

static inline int Abc_TtVarsAreSymmetric( word * pTruth, int nVars, int i, int j, word * pCof0, word * pCof1 )
{
    int nWords = Abc_TtWordNum( nVars );
    assert( i < nVars && j < nVars );
    Abc_TtCofactor0p( pCof0, pTruth, nWords, i );
    Abc_TtCofactor1p( pCof1, pTruth, nWords, i );
    Abc_TtCofactor1( pCof0, nWords, j );
    Abc_TtCofactor0( pCof1, nWords, j );
    return Abc_TtEqual( pCof0, pCof1, nWords );
}